

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-danger.c
# Opt level: O2

wchar_t borg_danger(wchar_t y,wchar_t x,wchar_t c,_Bool average,_Bool full_damage)

{
  chunk_conflict *c_00;
  _Bool _Var1;
  int16_t iVar2;
  loc lVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  long lVar6;
  long lVar7;
  
  lVar3 = (loc)loc(x,y);
  _Var1 = square_in_bounds(cave,lVar3);
  if (_Var1) {
    _Var1 = square_isvault(cave,lVar3);
    c_00 = cave;
    wVar4 = L'\0';
    if (borg.trait[0x69] < 0x51 && !_Var1) {
      wVar4 = (uint)borg_fear_region[y / 0xb][x / 0xb] * c;
    }
    wVar5 = L'Ĭ';
    if (wVar4 < L'Ĭ') {
      wVar5 = wVar4;
    }
    if (borg.trait[0x69] != 100) {
      wVar5 = wVar4;
    }
    if (borg.time_this_panel < 0xc9) {
      lVar3 = (loc)loc(x,y);
      _Var1 = square_isvault(c_00,lVar3);
      if (!_Var1) {
        wVar5 = wVar5 + (uint)borg_fear_monsters[y][x] * c;
      }
    }
    lVar7 = 0x1d8;
    iVar2 = borg_kills_nxt;
    for (lVar6 = 1; lVar6 < iVar2; lVar6 = lVar6 + 1) {
      if (*(short *)(borg_kills->spell + lVar7 + -0x19) != 0) {
        wVar4 = borg_danger_one_kill(y,x,c,(wchar_t)lVar6,average,true);
        wVar5 = wVar5 + wVar4;
        iVar2 = borg_kills_nxt;
      }
      lVar7 = lVar7 + 0x1d8;
    }
    wVar4 = L'ߐ';
    if (wVar5 < L'ߐ') {
      wVar4 = wVar5;
    }
  }
  else {
    wVar4 = L'ߐ';
  }
  return wVar4;
}

Assistant:

int borg_danger(int y, int x, int c, bool average, bool full_damage)
{
    int i, p = 0;

    struct loc l = loc(x, y);
    if (!square_in_bounds(cave, l))
        return 2000;

    /* Base danger (from regional fear) but not within a vault.  Cheating the
     * floor grid */
    if (!square_isvault(cave, l) && borg.trait[BI_CDEPTH] <= 80) {
        p += borg_fear_region[y / 11][x / 11] * c;
    }

    /* Reduce regional fear on Depth 100 */
    if (borg.trait[BI_CDEPTH] == 100 && p >= 300)
        p = 300;

    /* Added danger (from a lot of monsters).
     * But do not add it if we have been sitting on
     * this panel for too long, or monster's in a vault.  The fear_monsters[][]
     * can induce some bouncy behavior.
     */
    if (borg.time_this_panel <= 200 && !square_isvault(cave, loc(x, y)))
        p += borg_fear_monsters[y][x] * c;

    full_damage = true;

    /* Examine all the monsters */
    for (i = 1; i < borg_kills_nxt; i++) {
        borg_kill *kill = &borg_kills[i];

        /* Skip dead monsters */
        if (!kill->r_idx)
            continue;

        /* Collect danger from monster */
        p += borg_danger_one_kill(y, x, c, i, average, full_damage);
    }

    /* Return the danger */
    return (p > 2000 ? 2000 : p);
}